

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccpp.c
# Opt level: O1

uint8_t * parse_line_comment(uint8_t *p)

{
  BufferedFile *pBVar1;
  uint uVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  pbVar4 = p + 1;
LAB_001231a0:
  do {
    uVar2 = (uint)*pbVar4;
    do {
      if (uVar2 != 0x5c) {
        if ((uVar2 == 0xffffffff) || (uVar2 == 10)) {
          return pbVar4;
        }
        pbVar4 = pbVar4 + 1;
        goto LAB_001231a0;
      }
      file->buf_ptr = pbVar4;
      uVar2 = handle_eob();
      pbVar4 = file->buf_ptr;
    } while (uVar2 != 0x5c);
    uVar2 = (uint)pbVar4[1];
    pbVar3 = pbVar4 + 1;
    if (pbVar4[1] == 0x5c) {
      file->buf_ptr = pbVar3;
      uVar2 = handle_eob();
      pbVar3 = file->buf_ptr;
    }
    if (uVar2 == 0xd) {
      uVar2 = (uint)pbVar3[1];
      pbVar3 = pbVar3 + 1;
      if (uVar2 == 0x5c) {
        file->buf_ptr = pbVar3;
        uVar2 = handle_eob();
        pbVar3 = file->buf_ptr;
      }
    }
    pBVar1 = file;
    pbVar4 = pbVar3;
    if (uVar2 == 10) {
      file->line_num = file->line_num + 1;
      pbVar4 = pbVar3 + 1;
      if (pbVar3[1] == 0x5c) {
        pBVar1->buf_ptr = pbVar4;
        handle_eob();
        pbVar4 = file->buf_ptr;
      }
    }
  } while( true );
}

Assistant:

static uint8_t* parse_line_comment(uint8_t* p) {
  int c;

  p++;
  for (;;) {
    c = *p;
  redo:
    if (c == '\n' || c == CH_EOF) {
      break;
    } else if (c == '\\') {
      file->buf_ptr = p;
      c = handle_eob();
      p = file->buf_ptr;
      if (c == '\\') {
        PEEKC_EOB(c, p);
        if (c == '\n') {
          file->line_num++;
          PEEKC_EOB(c, p);
        } else if (c == '\r') {
          PEEKC_EOB(c, p);
          if (c == '\n') {
            file->line_num++;
            PEEKC_EOB(c, p);
          }
        }
      } else {
        goto redo;
      }
    } else {
      p++;
    }
  }
  return p;
}